

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UBool __thiscall
icu_63::SimpleFormatter::applyPatternMinMaxArguments
          (SimpleFormatter *this,UnicodeString *pattern,int32_t min,int32_t max,
          UErrorCode *errorCode)

{
  UnicodeString *this_00;
  ushort uVar1;
  short sVar2;
  bool bVar3;
  UBool UVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int32_t length;
  int iVar10;
  uint uVar11;
  char16_t *pcVar12;
  char16_t cVar13;
  uint uVar14;
  UChar local_6c;
  UChar local_6a [2];
  char16_t local_66;
  int32_t local_64;
  UErrorCode *local_60;
  ulong local_58;
  char16_t *local_50;
  int32_t local_44;
  SimpleFormatter *local_40;
  ulong local_38;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  uVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      local_50 = (pattern->fUnion).fFields.fArray;
    }
    else {
      local_50 = (char16_t *)((long)&pattern->fUnion + 2);
    }
  }
  else {
    local_50 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    uVar14 = (pattern->fUnion).fFields.fLength;
  }
  else {
    uVar14 = (int)(short)uVar1 >> 5;
  }
  this_00 = &this->compiledPattern;
  local_6c = L'\0';
  UnicodeString::unBogus(this_00);
  sVar2 = (this->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    length = (this->compiledPattern).fUnion.fFields.fLength;
  }
  else {
    length = (int)sVar2 >> 5;
  }
  UnicodeString::doReplace(this_00,0,length,&local_6c,0,1);
  if ((int)uVar14 < 1) {
    iVar7 = -1;
  }
  else {
    local_38 = (ulong)uVar14;
    local_58 = 0xffffffff;
    bVar3 = false;
    uVar11 = 0;
    pcVar12 = local_50;
    iVar7 = 0;
    local_64 = max;
    local_60 = errorCode;
    local_44 = min;
    local_40 = this;
    do {
      iVar10 = iVar7 + 1;
      cVar13 = pcVar12[iVar7];
      if (cVar13 == L'\'') {
        cVar13 = L'\'';
        if ((iVar10 < (int)uVar14) && (cVar13 = pcVar12[iVar10], cVar13 == L'\'')) {
          cVar13 = L'\'';
        }
        else {
          if (bVar3) {
            bVar3 = false;
            goto LAB_002b17c2;
          }
          if ((cVar13 != L'}') && (cVar13 != L'{')) {
            cVar13 = L'\'';
            bVar3 = false;
            goto LAB_002b1772;
          }
          bVar3 = true;
        }
        iVar10 = iVar7 + 2;
LAB_002b1772:
        if (uVar11 == 0) {
          local_6a[1] = 0xffff;
          UnicodeString::doAppend(this_00,local_6a + 1,0,1);
        }
        local_66 = cVar13;
        UnicodeString::doAppend(this_00,local_6a + 2,0,1);
        uVar11 = uVar11 + 1;
        pcVar12 = local_50;
        if (uVar11 == 0xfeff) {
          uVar11 = 0;
        }
      }
      else {
        if ((bVar3) || (cVar13 != L'{')) goto LAB_002b1772;
        if (0 < (int)uVar11) {
          sVar2 = (local_40->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar5 = (local_40->compiledPattern).fUnion.fFields.fLength;
          }
          else {
            iVar5 = (int)sVar2 >> 5;
          }
          UnicodeString::setCharAt(this_00,~uVar11 + iVar5,(short)uVar11 + L'Ā');
          uVar11 = 0;
          pcVar12 = local_50;
        }
        lVar8 = (long)(iVar7 + 2);
        if ((((int)uVar14 <= iVar7 + 2) ||
            (uVar6 = (ushort)pcVar12[iVar10] - 0x30, 9 < (ushort)uVar6)) || (pcVar12[lVar8] != L'}')
           ) {
          if ((iVar10 < (int)uVar14) && ((ushort)(pcVar12[iVar10] + L'ￏ') < 9)) {
            uVar6 = (ushort)pcVar12[iVar10] - 0x30;
            lVar9 = 0;
            while( true ) {
              if (local_38 - lVar8 == lVar9) goto LAB_002b18be;
              cVar13 = pcVar12[lVar8 + lVar9];
              if (9 < (ushort)(cVar13 + L'￐')) break;
              uVar6 = ((uint)(ushort)cVar13 + uVar6 * 10) - 0x30;
              lVar9 = lVar9 + 1;
              if (0xff < (int)uVar6) goto LAB_002b18be;
            }
            if ((-1 < (int)uVar6) && (cVar13 == L'}')) {
              iVar10 = iVar7 + 3 + (int)lVar9;
              goto LAB_002b188a;
            }
          }
LAB_002b18be:
          *local_60 = U_ILLEGAL_ARGUMENT_ERROR;
          goto LAB_002b18fa;
        }
        iVar10 = iVar7 + 3;
LAB_002b188a:
        iVar7 = (int)local_58;
        local_58 = local_58 & 0xffffffff;
        if (iVar7 < (int)uVar6) {
          local_58 = (ulong)uVar6;
        }
        local_6a[0] = (UChar)uVar6;
        bVar3 = false;
        UnicodeString::doAppend(this_00,local_6a,0,1);
        pcVar12 = local_50;
      }
LAB_002b17c2:
      min = local_44;
      iVar7 = iVar10;
    } while (iVar10 < (int)uVar14);
    if (0 < (int)uVar11) {
      sVar2 = (local_40->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar7 = (local_40->compiledPattern).fUnion.fFields.fLength;
      }
      else {
        iVar7 = (int)sVar2 >> 5;
      }
      UnicodeString::setCharAt(this_00,~uVar11 + iVar7,(short)uVar11 + L'Ā');
    }
    iVar7 = (int)local_58;
    errorCode = local_60;
    max = local_64;
  }
  if (iVar7 < max && min <= iVar7 + 1) {
    UnicodeString::setCharAt(this_00,0,(UChar)(iVar7 + 1));
    UVar4 = '\x01';
  }
  else {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002b18fa:
    UVar4 = '\0';
  }
  return UVar4;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }